

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::OneofDescriptor::GetLocationPath
          (OneofDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  iterator iVar1;
  int local_14;
  
  Descriptor::GetLocationPath(*(Descriptor **)(this + 0x10),output);
  iVar1._M_current =
       (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar1._M_current ==
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)output,iVar1,
               &DescriptorProto::kOneofDeclFieldNumber);
  }
  else {
    *iVar1._M_current = 8;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar1._M_current ==
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar1,&local_14);
  }
  else {
    *iVar1._M_current =
         (int)((ulong)((long)this - *(long *)(*(long *)(this + 0x10) + 0x40)) >> 4) * -0x55555555;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void OneofDescriptor::GetLocationPath(std::vector<int>* output) const {
  containing_type()->GetLocationPath(output);
  output->push_back(DescriptorProto::kOneofDeclFieldNumber);
  output->push_back(index());
}